

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O3

void TopLevelCMakeVarCondSet(cmMakefile *mf,string *name,string *value)

{
  bool bVar1;
  cmValue cVar2;
  
  cVar2 = cmMakefile::GetDefinition(mf,name);
  if (cVar2.Value != (string *)0x0) {
    bVar1 = cmMakefile::IsRootMakefile(mf);
    if (!bVar1) {
      return;
    }
  }
  cmMakefile::RemoveDefinition(mf,name);
  cmMakefile::AddCacheDefinition
            (mf,name,(value->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
  return;
}

Assistant:

static void TopLevelCMakeVarCondSet(cmMakefile& mf, std::string const& name,
                                    std::string const& value)
{
  // Set the CMAKE_PROJECT_XXX variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one.
  if (!mf.GetDefinition(name) || mf.IsRootMakefile()) {
    mf.RemoveDefinition(name);
    mf.AddCacheDefinition(name, value, "Value Computed by CMake",
                          cmStateEnums::STATIC);
  }
}